

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

int V_GetColorFromString(DWORD *palette,char *cstr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  char *pcStack_48;
  int color;
  char *p_1;
  size_t len;
  int iStack_30;
  char val [3];
  int p;
  int i;
  int c [3];
  char *cstr_local;
  DWORD *palette_local;
  
  len._3_1_ = 0;
  c._4_8_ = cstr;
  if (*cstr == '#') {
    p_1 = (char *)strlen(cstr);
    if (p_1 == (char *)0x7) {
      for (iStack_30 = 0; iStack_30 < 3; iStack_30 = iStack_30 + 1) {
        len._1_1_ = *(undefined1 *)(c._4_8_ + (long)(iStack_30 * 2 + 1));
        len._2_1_ = *(undefined1 *)(c._4_8_ + (long)(iStack_30 * 2 + 2));
        iVar2 = ParseHex((char *)((long)&len + 1));
        (&p)[iStack_30] = iVar2;
      }
    }
    else if (p_1 == (char *)0x4) {
      for (iStack_30 = 0; iStack_30 < 3; iStack_30 = iStack_30 + 1) {
        len._1_1_ = *(undefined1 *)(c._4_8_ + (long)(iStack_30 + 1));
        len._2_1_ = len._1_1_;
        iVar2 = ParseHex((char *)((long)&len + 1));
        (&p)[iStack_30] = iVar2;
      }
    }
    else {
      p = 0;
      i = 0;
      c[0] = 0;
    }
  }
  else {
    sVar4 = strlen(cstr);
    if (sVar4 == 6) {
      lVar5 = strtol((char *)c._4_8_,&stack0xffffffffffffffb8,0x10);
      uVar3 = (uint)lVar5;
      if (*pcStack_48 == '\0') {
        p = (int)(uVar3 & 0xff0000) >> 0x10;
        i = (int)(uVar3 & 0xff00) >> 8;
        c[0] = uVar3 & 0xff;
        goto LAB_00739429;
      }
    }
    for (iStack_30 = 0; iStack_30 < 3; iStack_30 = iStack_30 + 1) {
      while( true ) {
        bVar6 = false;
        if (*(char *)c._4_8_ < '!') {
          bVar6 = *(char *)c._4_8_ != '\0';
        }
        if (!bVar6) break;
        c._4_8_ = c._4_8_ + 1;
      }
      len._4_4_ = 0;
      for (; ' ' < *(char *)c._4_8_; c._4_8_ = c._4_8_ + 1) {
        if (len._4_4_ < 2) {
          *(undefined1 *)((long)&len + (long)len._4_4_ + 1) = *(undefined1 *)c._4_8_;
        }
        len._4_4_ = len._4_4_ + 1;
      }
      if (len._4_4_ == 0) {
        (&p)[iStack_30] = 0;
      }
      else {
        if (len._4_4_ == 1) {
          len._2_1_ = len._1_1_;
        }
        iVar2 = ParseHex((char *)((long)&len + 1));
        (&p)[iStack_30] = iVar2;
      }
    }
  }
LAB_00739429:
  if (palette == (DWORD *)0x0) {
    palette_local._4_4_ = p << 0x10 | i << 8 | c[0];
  }
  else {
    bVar1 = FColorMatcher::Pick(&ColorMatcher,p,i,c[0]);
    palette_local._4_4_ = (uint)bVar1;
  }
  return palette_local._4_4_;
}

Assistant:

int V_GetColorFromString (const DWORD *palette, const char *cstr)
{
	int c[3], i, p;
	char val[3];

	val[2] = '\0';

	// Check for HTML-style #RRGGBB or #RGB color string
	if (cstr[0] == '#')
	{
		size_t len = strlen (cstr);

		if (len == 7)
		{
			// Extract each eight-bit component into c[].
			for (i = 0; i < 3; ++i)
			{
				val[0] = cstr[1 + i*2];
				val[1] = cstr[2 + i*2];
				c[i] = ParseHex (val);
			}
		}
		else if (len == 4)
		{
			// Extract each four-bit component into c[], expanding to eight bits.
			for (i = 0; i < 3; ++i)
			{
				val[1] = val[0] = cstr[1 + i];
				c[i] = ParseHex (val);
			}
		}
		else
		{
			// Bad HTML-style; pretend it's black.
			c[2] = c[1] = c[0] = 0;
		}
	}
	else
	{
		if (strlen(cstr) == 6)
		{
			char *p;
			int color = strtol(cstr, &p, 16);
			if (*p == 0)
			{
				// RRGGBB string
				c[0] = (color & 0xff0000) >> 16;
				c[1] = (color & 0xff00) >> 8;
				c[2] = (color & 0xff);
			}
			else goto normal;
		}
		else
		{
normal:
			// Treat it as a space-delimited hexadecimal string
			for (i = 0; i < 3; ++i)
			{
				// Skip leading whitespace
				while (*cstr <= ' ' && *cstr != '\0')
				{
					cstr++;
				}
				// Extract a component and convert it to eight-bit
				for (p = 0; *cstr > ' '; ++p, ++cstr)
				{
					if (p < 2)
					{
						val[p] = *cstr;
					}
				}
				if (p == 0)
				{
					c[i] = 0;
				}
				else
				{
					if (p == 1)
					{
						val[1] = val[0];
					}
					c[i] = ParseHex (val);
				}
			}
		}
	}
	if (palette)
		return ColorMatcher.Pick (c[0], c[1], c[2]);
	else
		return MAKERGB(c[0], c[1], c[2]);
}